

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O3

bool __thiscall QPDFObjectHandle::isOrHasName(QPDFObjectHandle *this,string *value)

{
  bool bVar1;
  bool bVar2;
  QPDFObjectHandle *item;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> local_38;
  
  bVar1 = isNameAndEquals(this,value);
  bVar2 = true;
  if (!bVar1) {
    bVar1 = isArray(this);
    if (bVar1) {
      getArrayAsVector(&local_38,this);
      for (; local_38.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
             _M_impl.super__Vector_impl_data._M_start !=
             local_38.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
             _M_impl.super__Vector_impl_data._M_finish;
          local_38.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
          super__Vector_impl_data._M_start =
               local_38.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
               _M_impl.super__Vector_impl_data._M_start + 1) {
        bVar1 = isNameAndEquals(local_38.
                                super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                ._M_impl.super__Vector_impl_data._M_start,value);
        if (bVar1) {
          std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&local_38);
          return true;
        }
      }
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&local_38);
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool
QPDFObjectHandle::isOrHasName(std::string const& value) const
{
    if (isNameAndEquals(value)) {
        return true;
    } else if (isArray()) {
        for (auto& item: getArrayAsVector()) {
            if (item.isNameAndEquals(value)) {
                return true;
            }
        }
    }
    return false;
}